

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextedit.cpp
# Opt level: O3

void QTextEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  InputMethodQuery query;
  QFlagsStorage<Qt::TextInteractionFlag> *pQVar1;
  code *pcVar2;
  int *piVar3;
  qreal qVar4;
  qreal qVar5;
  QTextEditPrivate *this;
  undefined1 *puVar6;
  undefined1 *puVar7;
  QVariant argument;
  undefined1 uVar8;
  __atomic_base<int> _Var9;
  QFlagsStorage<Qt::TextInteractionFlag> QVar10;
  TextInteractionFlags TVar11;
  QTextDocument *pQVar12;
  QArrayData *pQVar13;
  int iVar14;
  undefined4 in_register_00000014;
  long lVar15;
  undefined4 in_register_00000034;
  QString *placeholderText;
  QWidgetTextControl *pQVar16;
  long in_FS_OFFSET;
  float range;
  undefined1 in_stack_ffffffffffffff78 [15];
  undefined1 in_stack_ffffffffffffff87;
  undefined1 in_stack_ffffffffffffff88 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    if (0x10 < (uint)_id) goto switchD_004a3773_caseD_3;
    pQVar1 = (QFlagsStorage<Qt::TextInteractionFlag> *)*_a;
    switch(_id) {
    case 0:
      QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x300);
      break;
    case 1:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x304);
      goto LAB_004a4488;
    case 2:
      documentTitle((QString *)&local_58,(QTextEdit *)_o);
      pQVar13 = *(QArrayData **)pQVar1;
      *(PrivateShared **)pQVar1 = local_58.shared;
      puVar6 = *(undefined1 **)(pQVar1 + 2);
      *(undefined8 *)(pQVar1 + 2) = local_58._8_8_;
      puVar7 = *(undefined1 **)(pQVar1 + 4);
      *(undefined8 *)(pQVar1 + 4) = local_58._16_8_;
      local_58._8_8_ = puVar6;
      local_58._16_8_ = puVar7;
      goto LAB_004a3db3;
    case 3:
      uVar8 = isUndoRedoEnabled((QTextEdit *)_o);
      goto LAB_004a4488;
    case 4:
      QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x314);
      break;
    case 5:
      QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x318);
      break;
    case 6:
      if (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8) == (QWidgetTextControl *)0x0) {
        uVar8 = 1;
      }
      else {
        TVar11 = QWidgetTextControl::textInteractionFlags
                           (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
        uVar8 = ((uint)TVar11.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0;
      }
      goto LAB_004a4488;
    case 7:
      QWidgetTextControl::toMarkdown
                ((QString *)&local_58,*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                 (MarkdownFeatures)0x104f0c);
      goto LAB_004a3d87;
    case 8:
      QWidgetTextControl::toHtml
                ((QString *)&local_58,*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      goto LAB_004a3d87;
    case 9:
      QWidgetTextControl::toPlainText
                ((QString *)&local_58,*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
LAB_004a3d87:
      pQVar13 = *(QArrayData **)pQVar1;
      *(PrivateShared **)pQVar1 = local_58.shared;
      puVar6 = *(undefined1 **)(pQVar1 + 2);
      *(undefined8 *)(pQVar1 + 2) = local_58._8_8_;
      puVar7 = *(undefined1 **)(pQVar1 + 4);
      *(undefined8 *)(pQVar1 + 4) = local_58._16_8_;
      local_58._8_8_ = puVar6;
      local_58._16_8_ = puVar7;
LAB_004a3db3:
      local_58.shared = (PrivateShared *)pQVar13;
      if (pQVar13 != (QArrayData *)0x0) {
        LOCK();
        (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar13,2,0x10);
        }
      }
      goto switchD_004a3773_caseD_3;
    case 10:
      uVar8 = QWidgetTextControl::overwriteMode(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8))
      ;
      goto LAB_004a4488;
    case 0xb:
      qVar4 = tabStopDistance((QTextEdit *)_o);
      *(qreal *)pQVar1 = qVar4;
      goto switchD_004a3773_caseD_3;
    case 0xc:
      uVar8 = QWidgetTextControl::acceptRichText
                        (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
LAB_004a4488:
      *(undefined1 *)&pQVar1->i = uVar8;
      goto switchD_004a3773_caseD_3;
    case 0xd:
      QVar10.i = QWidgetTextControl::cursorWidth
                           (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      break;
    case 0xe:
      QVar10.i = (Int)QWidgetTextControl::textInteractionFlags
                                (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      break;
    case 0xf:
      pQVar12 = QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      *(QTextDocument **)pQVar1 = pQVar12;
      goto switchD_004a3773_caseD_3;
    case 0x10:
      lVar15 = *(long *)(_o + 8);
      piVar3 = *(int **)(lVar15 + 0x340);
      qVar4 = *(qreal *)(lVar15 + 0x348);
      qVar5 = *(qreal *)(lVar15 + 0x350);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      pQVar13 = *(QArrayData **)pQVar1;
      *(int **)pQVar1 = piVar3;
      *(qreal *)(pQVar1 + 2) = qVar4;
      *(qreal *)(pQVar1 + 4) = qVar5;
      if (pQVar13 != (QArrayData *)0x0) {
        LOCK();
        (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            QArrayData::deallocate(pQVar13,2,0x10);
            return;
          }
          goto LAB_004a44bf;
        }
      }
      goto switchD_004a3773_caseD_3;
    }
    pQVar1->i = QVar10.i;
    goto switchD_004a3773_caseD_3;
  case WriteProperty:
    if (0x10 < (uint)_id) goto switchD_004a3773_caseD_3;
    placeholderText = (QString *)*_a;
    switch(_id) {
    case 0:
      *(undefined4 *)(*(long *)(_o + 8) + 0x300) = *(undefined4 *)&(placeholderText->d).d;
      goto switchD_004a3773_caseD_3;
    case 1:
      *(undefined1 *)(*(long *)(_o + 8) + 0x304) = *(undefined1 *)&(placeholderText->d).d;
      goto switchD_004a3773_caseD_3;
    case 2:
      pQVar12 = QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QTextDocument::setMetaInformation((MetaInformation)pQVar12,(QString *)0x0);
        return;
      }
      break;
    case 3:
      pQVar12 = QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QTextDocument::setUndoRedoEnabled(SUB81(pQVar12,0));
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setLineWrapMode((QTextEdit *)_o,*(LineWrapMode *)&(placeholderText->d).d);
        return;
      }
      break;
    case 5:
      this = *(QTextEditPrivate **)(_o + 8);
      this->lineWrapColumnOrWidth = *(int *)&(placeholderText->d).d;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QTextEditPrivate::relayoutDocument(this);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setReadOnly((QTextEdit *)_o,*(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 7:
      pQVar16 = *(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8);
      lVar15 = *(long *)(in_FS_OFFSET + 0x28);
      goto joined_r0x004a3b4e;
    case 8:
      lVar15 = *(long *)(_o + 8);
      pQVar16 = *(QWidgetTextControl **)(lVar15 + 0x2f8);
      goto LAB_004a418b;
    case 9:
      lVar15 = *(long *)(_o + 8);
      pQVar16 = *(QWidgetTextControl **)(lVar15 + 0x2f8);
      goto LAB_004a3ef3;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetTextControl::setOverwriteMode
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   *(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setTabStopDistance((QTextEdit *)_o,(qreal)(placeholderText->d).d);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetTextControl::setAcceptRichText
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   *(bool *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetTextControl::setCursorWidth
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   *(int *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetTextControl::setTextInteractionFlags
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                   *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)&(placeholderText->d).d);
        return;
      }
      break;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setDocument((QTextEdit *)_o,(QTextDocument *)(placeholderText->d).d);
        return;
      }
      break;
    case 0x10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        setPlaceholderText((QTextEdit *)_o,placeholderText);
        return;
      }
    }
    goto LAB_004a44bf;
  default:
    goto switchD_004a3773_caseD_3;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar15 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == textChanged && lVar15 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == undoAvailable && lVar15 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == redoAvailable && lVar15 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == currentCharFormatChanged && lVar15 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == copyAvailable && lVar15 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == selectionChanged && lVar15 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar2 == cursorPositionChanged && lVar15 == 0) {
      *(undefined4 *)*_a = 6;
    }
    goto switchD_004a3773_caseD_3;
  case RegisterPropertyMetaType:
    if (_id == 0xf) {
      _Var9._M_i = (__int_type)
                   QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType.typeId._q_value.
                   super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        _Var9._M_i = QMetaType::registerHelper
                               (&QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType);
      }
      ((__atomic_base<int> *)*_a)->_M_i = _Var9._M_i;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
    goto switchD_004a3773_caseD_3;
  }
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar14 = 0;
LAB_004a4270:
      QMetaObject::activate(_o,&staticMetaObject,iVar14,(void **)0x0);
      return;
    }
    break;
  case 1:
    local_58._8_8_ = &stack0xffffffffffffff87;
    iVar14 = 1;
    goto LAB_004a4151;
  case 2:
    local_58._8_8_ = &stack0xffffffffffffff87;
    iVar14 = 2;
    goto LAB_004a4151;
  case 3:
    local_58._8_8_ = _a[1];
    iVar14 = 3;
    goto LAB_004a4151;
  case 4:
    local_58._8_8_ = &stack0xffffffffffffff87;
    iVar14 = 4;
LAB_004a4151:
    local_58.shared = (PrivateShared *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar14,&local_58.shared);
  default:
switchD_004a3773_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar14 = 5;
      goto LAB_004a4270;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar14 = 6;
      goto LAB_004a4270;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setFontPointSize((QTextEdit *)_o,*_a[1]);
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setFontFamily((QTextEdit *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setFontWeight((QTextEdit *)_o,*_a[1]);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setFontUnderline((QTextEdit *)_o,*_a[1]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setFontItalic((QTextEdit *)_o,*_a[1]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setTextColor((QTextEdit *)_o,(QColor *)_a[1]);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setTextBackgroundColor((QTextEdit *)_o,(QColor *)_a[1]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setCurrentFont((QTextEdit *)_o,(QFont *)_a[1]);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setAlignment((QTextEdit *)_o,
                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                   ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)_a[1])->
                   super_QFlagsStorage<Qt::AlignmentFlag>);
      return;
    }
    break;
  case 0x10:
    placeholderText = (QString *)_a[1];
    lVar15 = *(long *)(_o + 8);
    pQVar16 = *(QWidgetTextControl **)(lVar15 + 0x2f8);
LAB_004a3ef3:
    QWidgetTextControl::setPlainText(pQVar16,placeholderText);
    *(byte *)(lVar15 + 800) = *(byte *)(lVar15 + 800) & 0xfd;
    goto switchD_004a3773_caseD_3;
  case 0x11:
    placeholderText = (QString *)_a[1];
    lVar15 = *(long *)(_o + 8);
    pQVar16 = *(QWidgetTextControl **)(lVar15 + 0x2f8);
LAB_004a418b:
    QWidgetTextControl::setHtml(pQVar16,placeholderText);
    *(byte *)(lVar15 + 800) = *(byte *)(lVar15 + 800) | 2;
    goto switchD_004a3773_caseD_3;
  case 0x12:
    placeholderText = (QString *)_a[1];
    pQVar16 = *(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8);
    lVar15 = *(long *)(in_FS_OFFSET + 0x28);
joined_r0x004a3b4e:
    if (lVar15 == local_30) {
      QWidgetTextControl::setMarkdown(pQVar16,placeholderText);
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setText((QTextEdit *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::cut(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::copy
                (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                 (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,_c),
                 (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
      return;
    }
    break;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::paste(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),Clipboard);
      return;
    }
    break;
  case 0x17:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::undo(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      return;
    }
    break;
  case 0x18:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::redo(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      return;
    }
    break;
  case 0x19:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::clear(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      return;
    }
    break;
  case 0x1a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::selectAll(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      return;
    }
    break;
  case 0x1b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::insertPlainText
                (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),(QString *)_a[1]);
      return;
    }
    break;
  case 0x1c:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetTextControl::insertHtml
                (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),(QString *)_a[1]);
      return;
    }
    break;
  case 0x1d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      append((QTextEdit *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case 0x1e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      scrollToAnchor((QTextEdit *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case 0x1f:
    range = (float)*_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
LAB_004a435c:
      zoomInF((QTextEdit *)_o,range);
      return;
    }
    break;
  case 0x20:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      range = 1.0;
      goto LAB_004a435c;
    }
    break;
  case 0x21:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      range = (float)-*_a[1];
      goto LAB_004a435c;
    }
    break;
  case 0x22:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      range = -1.0;
      goto LAB_004a435c;
    }
    break;
  case 0x23:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)_o + 0x1c8))(&local_58,_o,*_a[1],_a[2]);
    goto LAB_004a3e6e;
  case 0x24:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    query = *_a[1];
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffff88,(QVariant *)_a[2]);
    argument.d.data.data[0xf] = in_stack_ffffffffffffff87;
    argument.d.data._0_15_ = in_stack_ffffffffffffff78;
    argument.d._16_16_ = in_stack_ffffffffffffff88;
    inputMethodQuery((QVariant *)&local_58,(QTextEdit *)_o,query,argument);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff88);
LAB_004a3e6e:
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    goto switchD_004a3773_caseD_3;
  }
LAB_004a44bf:
  __stack_chk_fail();
}

Assistant:

void QTextEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->setFontPointSize((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setFontFamily((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFontWeight((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->setFontUnderline((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 11: _t->setFontItalic((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->setTextColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 13: _t->setTextBackgroundColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 14: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 15: _t->setAlignment((*reinterpret_cast< std::add_pointer_t<Qt::Alignment>>(_a[1]))); break;
        case 16: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 17: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste(); break;
        case 23: _t->undo(); break;
        case 24: _t->redo(); break;
        case 25: _t->clear(); break;
        case 26: _t->selectAll(); break;
        case 27: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 28: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->scrollToAnchor((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->zoomIn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 32: _t->zoomIn(); break;
        case 33: _t->zoomOut((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 34: _t->zoomOut(); break;
        case 35: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 36: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(const QTextCharFormat & )>(_a, &QTextEdit::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::cursorPositionChanged, 6))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 15:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QTextDocument* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<AutoFormatting>(_v, _t->autoFormatting()); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->tabChangesFocus(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->documentTitle(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 4: *reinterpret_cast<LineWrapMode*>(_v) = _t->lineWrapMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->lineWrapColumnOrWidth(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->toMarkdown(); break;
        case 8: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->toPlainText(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 11: *reinterpret_cast<qreal*>(_v) = _t->tabStopDistance(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 14: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 15: *reinterpret_cast<QTextDocument**>(_v) = _t->document(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoFormatting(*reinterpret_cast<AutoFormatting*>(_v)); break;
        case 1: _t->setTabChangesFocus(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setDocumentTitle(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setLineWrapMode(*reinterpret_cast<LineWrapMode*>(_v)); break;
        case 5: _t->setLineWrapColumnOrWidth(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setMarkdown(*reinterpret_cast<QString*>(_v)); break;
        case 8: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 9: _t->setPlainText(*reinterpret_cast<QString*>(_v)); break;
        case 10: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setTabStopDistance(*reinterpret_cast<qreal*>(_v)); break;
        case 12: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 14: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 15: _t->setDocument(*reinterpret_cast<QTextDocument**>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}